

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O0

uint32_t __thiscall
booster::locale::impl_posix::mb2_iconv_converter::to_unicode
          (mb2_iconv_converter *this,char **begin,char *end)

{
  byte bVar1;
  element_type *this_00;
  reference pvVar2;
  char **in;
  undefined8 uVar3;
  long in_RDX;
  long *in_RSI;
  mb2_iconv_converter *in_RDI;
  char *outbuf;
  size_t outsize;
  uint32_t result [2];
  size_t insize;
  char *inbuf;
  char inseq [3];
  uint32_t index;
  uchar seq0;
  char **in_stack_ffffffffffffff88;
  __shared_ptr_access<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff90;
  iconv_t *insize_00;
  uint32_t local_4;
  
  if (*in_RSI == in_RDX) {
    local_4 = 0xfffffffe;
  }
  else {
    bVar1 = *(byte *)*in_RSI;
    this_00 = std::
              __shared_ptr_access<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*(in_stack_ffffffffffffff90);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (this_00,(ulong)bVar1);
    local_4 = *pvVar2;
    if (local_4 == 0xffffffff) {
      local_4 = 0xffffffff;
    }
    else if (local_4 == 0xfffffffe) {
      if (*in_RSI + 1 == in_RDX) {
        local_4 = 0xfffffffe;
      }
      else {
        insize_00 = &in_RDI->to_utf_;
        in = (char **)utf32_encoding();
        uVar3 = std::__cxx11::string::c_str();
        open(in_RDI,(char *)insize_00,(int)in,uVar3);
        call_iconv(in_RDI,in,(size_t *)insize_00,in_stack_ffffffffffffff88,(size_t *)0x281fb0);
        local_4 = 0xffffffff;
      }
    }
    else {
      *in_RSI = *in_RSI + 1;
    }
  }
  return local_4;
}

Assistant:

uint32_t to_unicode(char const *&begin,char const *end)
        {
            if(begin == end)
                return incomplete;
            
            unsigned char seq0 = *begin;
            uint32_t index = (*first_byte_table_)[seq0];
            if(index == illegal)
                return illegal;
            if(index != incomplete) {
                begin++;
                return index;
            }
            else if(begin+1 == end)
                return incomplete;
            
            open(to_utf_,utf32_encoding(),encoding_.c_str());

            // maybe illegal or may be double byte

            char inseq[3] = { static_cast<char>(seq0) , begin[1], 0};
            char *inbuf = inseq;
            size_t insize = 3;
            uint32_t result[2] = { illegal, illegal };
            size_t outsize = 8;
            char *outbuf = reinterpret_cast<char*>(result);
            call_iconv(to_utf_,&inbuf,&insize,&outbuf,&outsize);
            if(outsize == 0 && insize == 0 && result[1]==0 ) {
                begin+=2;
                return result[0];
            }
            return illegal;
        }